

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O2

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::write_websocket(coro_http_client *this,string_view data,opcode op)

{
  element_type *peVar1;
  undefined7 in_register_00000009;
  undefined1 in_R8B;
  
  peVar1 = (element_type *)operator_new(0xf0,(nothrow_t *)&std::nothrow);
  if (peVar1 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         write_websocket;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)write_websocket;
    *(undefined1 *)((long)(peVar1->parser_).headers_._M_elems + 0xa1) = in_R8B;
    *(char **)((long)(peVar1->parser_).headers_._M_elems + 0x98) = (char *)data._M_len;
    *(char **)((long)(peVar1->parser_).headers_._M_elems + 0x78) = data._M_str;
    (((http_header *)((long)(peVar1->parser_).headers_._M_elems + 0x80))->name)._M_len =
         CONCAT71(in_register_00000009,op);
    *(undefined8 *)&peVar1->parser_ = 0;
    (peVar1->parser_).msg_._M_len = 0;
    (peVar1->parser_).msg_._M_str = (char *)0x0;
    *(undefined1 *)((long)(peVar1->parser_).headers_._M_elems + 0x18) = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    *(undefined1 *)
     &(((http_header *)((long)(peVar1->parser_).headers_._M_elems + 0xa0))->name)._M_len = 0;
  }
  return (LazyBase<cinatra::resp_data,_false>)(LazyBase<cinatra::resp_data,_false>)this;
}

Assistant:

async_simple::coro::Lazy<resp_data> write_websocket(
      std::string_view data, opcode op = opcode::text) {
    std::string str(data);
    co_return co_await write_websocket(str, op);
  }